

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

s32 __thiscall
irr::core::array<irr::scene::CMeshCache::MeshEntry>::binary_search
          (array<irr::scene::CMeshCache::MeshEntry> *this,MeshEntry *element,s32 left,s32 right)

{
  bool bVar1;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  __last;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  __val;
  difference_type dVar2;
  int in_ECX;
  int in_EDX;
  MeshEntry *in_RSI;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  it;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  rpos;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  lpos;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  in_stack_ffffffffffffff88;
  MeshEntry *in_stack_ffffffffffffff90;
  __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
  in_stack_ffffffffffffffb8;
  
  if (in_EDX <= in_ECX) {
    std::
    vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>::
    begin((vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
           *)in_stack_ffffffffffffff88._M_current);
    __last = ::std::
             next<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry_const*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>>
                       (in_stack_ffffffffffffff88,0x3062b5);
    std::
    vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>::
    begin((vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
           *)in_stack_ffffffffffffff88._M_current);
    __val = ::std::
            next<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry_const*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>>
                      (in_stack_ffffffffffffff88,0x3062d8);
    ::std::
    lower_bound<__gnu_cxx::__normal_iterator<irr::scene::CMeshCache::MeshEntry_const*,std::vector<irr::scene::CMeshCache::MeshEntry,std::allocator<irr::scene::CMeshCache::MeshEntry>>>,irr::scene::CMeshCache::MeshEntry>
              (in_stack_ffffffffffffffb8,__last,__val._M_current);
    __gnu_cxx::
    __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
    ::operator*((__normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                 *)&stack0xffffffffffffffb8);
    bVar1 = irr::scene::CMeshCache::MeshEntry::operator<
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88._M_current);
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
      ::operator*((__normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                   *)&stack0xffffffffffffffb8);
      bVar1 = irr::scene::CMeshCache::MeshEntry::operator<
                        (in_RSI,in_stack_ffffffffffffff88._M_current);
      if (!bVar1) {
        std::
        vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
        ::begin((vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>
                 *)in_stack_ffffffffffffff88._M_current);
        dVar2 = __gnu_cxx::operator-
                          ((__normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                            *)in_RSI,
                           (__normal_iterator<const_irr::scene::CMeshCache::MeshEntry_*,_std::vector<irr::scene::CMeshCache::MeshEntry,_std::allocator<irr::scene::CMeshCache::MeshEntry>_>_>
                            *)in_stack_ffffffffffffff88._M_current);
        return (s32)dVar2;
      }
    }
  }
  return -1;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}